

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O2

void __thiscall icu_63::UVector64::setSize(UVector64 *this,int32_t newSize)

{
  int64_t *piVar1;
  UBool UVar2;
  uint in_EAX;
  long lVar3;
  UErrorCode ec;
  undefined8 uStack_18;
  
  if (-1 < newSize) {
    if (this->count < newSize) {
      uStack_18 = (ulong)in_EAX;
      UVar2 = ensureCapacity(this,newSize,(UErrorCode *)((long)&uStack_18 + 4));
      if (UVar2 == '\0') {
        return;
      }
      piVar1 = this->elements;
      for (lVar3 = (long)this->count; lVar3 < (long)(ulong)(uint)newSize; lVar3 = lVar3 + 1) {
        piVar1[lVar3] = 0;
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector64::setSize(int32_t newSize) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        UErrorCode ec = U_ZERO_ERROR;
        if (!ensureCapacity(newSize, ec)) {
            return;
        }
        for (i=count; i<newSize; ++i) {
            elements[i] = 0;
        }
    } 
    count = newSize;
}